

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O3

int usageAndExit(char *argv0,int ec)

{
  int iVar1;
  size_t sVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
  if (argv0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1092a0);
  }
  else {
    sVar2 = strlen(argv0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,argv0,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[--imf|--core] <file1> [<file2>...]",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
  std::ostream::put(-0x60);
  iVar1 = std::ostream::flush();
  return iVar1;
}

Assistant:

static int
usageAndExit (const char* argv0, int ec)
{
    std::cerr << "Usage: " << argv0 << "[--imf|--core] <file1> [<file2>...]"
              << std::endl;
    return ec;
}